

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O3

TPZMultiphysicsCompMesh * __thiscall
TPZHybridizeHDiv::Hybridize
          (TPZHybridizeHDiv *this,TPZMultiphysicsCompMesh *multiphysics,bool group_elements,
          double Lagrange_term_multiplier)

{
  int iVar1;
  TPZVec<TPZCompMesh_*> *pTVar2;
  TPZCompMesh *pTVar3;
  TPZMultiphysicsCompMesh *this_00;
  
  pTVar2 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  ComputePeriferalMaterialIds(this,pTVar2);
  pTVar2 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  if ((1 < pTVar2->fNElements) &&
     ((pTVar2->fStore[1]->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    iVar1 = (**(code **)(*(long *)(pTVar2->fStore[1]->fMaterialVec)._M_t._M_impl.
                                  super__Rb_tree_header._M_header._M_left[1]._M_parent + 0x78))();
    this->fNState = iVar1;
  }
  pTVar3 = CreateMultiphysicsMesh(this,multiphysics,1.0);
  this_00 = (TPZMultiphysicsCompMesh *)
            __dynamic_cast(pTVar3,&TPZCompMesh::typeinfo,&TPZMultiphysicsCompMesh::typeinfo,0);
  pTVar2 = TPZMultiphysicsCompMesh::MeshVector(this_00);
  CreateInterfaceElements(this,(TPZCompMesh *)this_00,pTVar2);
  if (group_elements) {
    GroupandCondenseElements((TPZCompMesh *)this_00);
  }
  return this_00;
}

Assistant:

TPZMultiphysicsCompMesh *TPZHybridizeHDiv::Hybridize(TPZMultiphysicsCompMesh *multiphysics, bool group_elements, double Lagrange_term_multiplier)
{
    ComputePeriferalMaterialIds(multiphysics->MeshVector());
    ComputeNState(multiphysics->MeshVector());
//    InsertPeriferalMaterialObjects(multiphysics->MeshVector());
//    HybridizeInternalSides(multiphysics->MeshVector());
    TPZCompMesh *cmesh = CreateMultiphysicsMesh(multiphysics);
    TPZMultiphysicsCompMesh *result = dynamic_cast<TPZMultiphysicsCompMesh *>(cmesh);
    CreateInterfaceElements(result);
    if(group_elements)
    {
      GroupandCondenseElements(result);
    }
    if(!result) DebugStop();
    return result;

}